

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_zvpbeint.c
# Opt level: O3

void gga_c_zvpbeint_init(xc_func_type *p)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 *puVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long extraout_RDX;
  long lVar12;
  long in_RSI;
  long *plVar13;
  long *in_R8;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dStack_e0;
  
  plVar13 = (long *)0x18;
  puVar8 = (undefined4 *)malloc(0x18);
  p->params = puVar8;
  uVar17 = p->info->number;
  uVar10 = (ulong)uVar17;
  if (uVar17 == 0x22d) {
    uVar15 = 0x76c8b439;
    uVar16 = 0x3faa9fbe;
    uVar18 = 0;
    uVar19 = 0x3ff00000;
  }
  else {
    if (uVar17 != 0x22e) {
      gga_c_zvpbeint_init_cold_1();
      if (in_RSI != 0) {
        lVar12 = 0;
        do {
          lVar9 = (int)plVar13[9] * lVar12;
          dVar24 = *(double *)(extraout_RDX + lVar9 * 8);
          if ((int)plVar13[1] == 2) {
            dVar24 = dVar24 + *(double *)(extraout_RDX + 8 + lVar9 * 8);
          }
          dVar23 = (double)plVar13[0x30];
          if (dVar23 <= dVar24) {
            dVar24 = *(double *)(extraout_RDX + lVar9 * 8);
            uVar15 = SUB84(dVar24,0);
            uVar16 = (undefined4)((ulong)dVar24 >> 0x20);
            if (dVar24 <= dVar23) {
              uVar15 = SUB84(dVar23,0);
              uVar16 = (undefined4)((ulong)dVar23 >> 0x20);
            }
            dVar20 = (double)CONCAT44(uVar16,uVar15);
            dVar24 = (double)plVar13[0x32];
            dVar23 = *(double *)(uVar10 + *(int *)((long)plVar13 + 0x4c) * lVar12 * 8);
            pdVar1 = (double *)plVar13[0x2f];
            dVar2 = cbrt(0.3183098861837907);
            dVar3 = cbrt(dVar20);
            dVar21 = (dVar2 * 1.4422495703074083 * 2.519842099789747) / dVar3;
            dVar22 = SQRT(dVar21);
            dStack_e0 = dVar22;
            if (dVar21 < 0.0) {
              dStack_e0 = sqrt(dVar21);
            }
            dVar24 = dVar24 * dVar24;
            if (dVar23 <= dVar24) {
              dVar23 = dVar24;
            }
            if (dVar21 < 0.0) {
              dVar22 = sqrt(dVar21);
            }
            dVar25 = (dVar2 * dVar2 * 2.080083823051904 * 1.5874010519681996) / (dVar3 * dVar3);
            dVar4 = log(16.081979498692537 /
                        (dVar25 * 0.123235 +
                        dVar22 * dVar21 * 0.204775 + dStack_e0 * 3.79785 + dVar21 * 0.8969) + 1.0);
            dVar24 = (double)plVar13[0x31];
            dVar5 = cbrt(dVar24);
            uVar14 = -(ulong)(1.0 <= dVar24);
            uVar17 = ~(uint)(uVar14 >> 0x20) & 0x3ff00000;
            dVar26 = (double)((ulong)(dVar24 * dVar5) & uVar14 | (ulong)uVar17 << 0x20);
            dVar24 = log(29.608749977793437 /
                         (dVar25 * 0.1241775 +
                         dVar22 * dVar21 * 0.1100325 + dStack_e0 * 5.1785 + dVar21 * 0.905775) + 1.0
                        );
            if (dVar23 < 0.0) {
              dVar22 = sqrt(dVar23);
            }
            else {
              dVar22 = SQRT(dVar23);
            }
            dVar25 = pdVar1[1];
            dVar20 = dVar20 * dVar20;
            dVar6 = (1.0 / dVar2) * 2.080083823051904 * 1.5874010519681996 * dVar3;
            if (dVar6 < 0.0) {
              dVar6 = sqrt(dVar6);
            }
            else {
              dVar6 = SQRT(dVar6);
            }
            dVar7 = pow(1e-20,pdVar1[2] * 0.5);
            dVar22 = exp(dVar7 * ((1.0 / dStack_e0) / dVar21) * dVar6 *
                         (1.0 / (dVar20 * dVar20)) * dVar22 * dVar23 * dVar25 * -0.0625);
            dVar25 = (double)((ulong)uVar17 << 0x20 | uVar14 & (ulong)(dVar5 * dVar5));
            dVar5 = dVar25 * dVar25;
            dVar21 = dVar24 * (dVar21 * 0.0278125 + 1.0) *
                              ((dVar26 + dVar26 + -2.0) / 0.5198420997897464) * 0.0197516734986138 +
                     dVar4 * (dVar21 * 0.053425 + 1.0) * -0.0621814;
            dVar24 = *pdVar1;
            dVar4 = exp(dVar21 * -3.258891353270929 * 9.869604401089358 * (1.0 / (dVar25 * dVar5)));
            dVar24 = (1.0 / (dVar4 + -1.0)) * 9.869604401089358 * dVar24 * 3.258891353270929;
            dVar23 = ((1.0 / (dVar2 * dVar2)) * 1.4422495703074083 * 2.519842099789747 *
                      (1.0 / (dVar5 * dVar5)) *
                      ((1.0 / (dVar3 * dVar3)) / (dVar20 * dVar20)) * 1.5874010519681996 *
                     dVar23 * dVar23 * dVar24) / 3072.0 +
                     (((1.0 / dVar3) / dVar20) * dVar23 * 1.2599210498948732 *
                     (1.0 / dVar5) * 2.080083823051904 * (1.0 / dVar2) * 1.5874010519681996) / 96.0;
            dVar24 = log((1.0 / (dVar24 * dVar23 + 1.0)) * 32.163968442914815 * dVar23 * *pdVar1 +
                         1.0);
            lVar9 = *in_R8;
            if ((lVar9 != 0) && ((*(byte *)(*plVar13 + 0x40) & 1) != 0)) {
              lVar11 = (int)plVar13[0xb] * lVar12;
              *(double *)(lVar9 + lVar11 * 8) =
                   dVar21 + dVar22 * 0.3068528194400547 *
                            dVar25 * dVar5 * 0.10132118364233778 * dVar24 +
                   *(double *)(lVar9 + lVar11 * 8);
            }
          }
          lVar12 = lVar12 + 1;
        } while (in_RSI != lVar12);
      }
      return;
    }
    uVar15 = 0xdf3b645a;
    uVar16 = 0x3fa78d4f;
    uVar18 = 0xcccccccd;
    uVar19 = 0x3ffccccc;
  }
  *puVar8 = uVar15;
  puVar8[1] = uVar16;
  puVar8[2] = uVar18;
  puVar8[3] = uVar19;
  *(undefined8 *)(puVar8 + 4) = 0x4012000000000000;
  return;
}

Assistant:

static void
gga_c_zvpbeint_init(xc_func_type *p)
{
  gga_c_zvpbeint_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_c_zvpbeint_params));
  params = (gga_c_zvpbeint_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_C_ZVPBEINT:
    params->beta  = 0.052;
    params->alpha = 1.0;
    params->omega = 4.5;
    break;
  case XC_GGA_C_ZVPBESOL:
    params->beta  = 0.046;
    params->alpha = 1.8;
    params->omega = 4.5;
    break;
  default:
    fprintf(stderr, "Internal error in gga_c_zvpbeint\n");
    exit(1);
  }
}